

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O2

void FT_Vector_Rotate(FT_Vector *vec,FT_Angle angle)

{
  FT_Int FVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  FT_Vector v;
  FT_Vector local_38;
  
  if (angle != 0 && vec != (FT_Vector *)0x0) {
    local_38.x = vec->x;
    local_38.y = vec->y;
    if (local_38.y != 0 || local_38.x != 0) {
      FVar1 = ft_trig_prenorm(&local_38);
      ft_trig_pseudo_rotate(&local_38,angle);
      lVar6 = -local_38.x;
      if (0 < local_38.x) {
        lVar6 = local_38.x;
      }
      uVar3 = lVar6 * 0xdbd95b16 + 0x40000000U >> 0x20;
      uVar5 = -uVar3;
      if (-1 < local_38.x) {
        uVar5 = uVar3;
      }
      lVar6 = -local_38.y;
      if (0 < local_38.y) {
        lVar6 = local_38.y;
      }
      uVar4 = lVar6 * 0xdbd95b16 + 0x40000000U >> 0x20;
      uVar3 = -uVar4;
      if (-1 < local_38.y) {
        uVar3 = uVar4;
      }
      bVar2 = (byte)FVar1;
      if (FVar1 < 1) {
        vec->x = uVar5 << (-bVar2 & 0x3f);
        lVar6 = uVar3 << (-bVar2 & 0x3f);
      }
      else {
        lVar6 = (long)(1 << (bVar2 - 1 & 0x1f));
        vec->x = (long)(((long)uVar5 >> 0x3f) + uVar5 + lVar6) >> (bVar2 & 0x3f);
        lVar6 = (long)(((long)uVar3 >> 0x3f) + lVar6 + uVar3) >> (bVar2 & 0x3f);
      }
      vec->y = lVar6;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Rotate( FT_Vector*  vec,
                    FT_Angle    angle )
  {
    FT_Int     shift;
    FT_Vector  v;


    if ( !vec || !angle )
      return;

    v = *vec;

    if ( v.x == 0 && v.y == 0 )
      return;

    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_rotate( &v, angle );
    v.x = ft_trig_downscale( v.x );
    v.y = ft_trig_downscale( v.y );

    if ( shift > 0 )
    {
      FT_Int32  half = (FT_Int32)1L << ( shift - 1 );


      vec->x = ( v.x + half - ( v.x < 0 ) ) >> shift;
      vec->y = ( v.y + half - ( v.y < 0 ) ) >> shift;
    }
    else
    {
      shift  = -shift;
      vec->x = (FT_Pos)( (FT_ULong)v.x << shift );
      vec->y = (FT_Pos)( (FT_ULong)v.y << shift );
    }
  }